

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

bool __thiscall
libcellml::Generator::GeneratorImpl::isNegativeNumber
          (GeneratorImpl *this,AnalyserEquationAstPtr *ast)

{
  bool bVar1;
  Type TVar2;
  double doubleValue;
  double local_30;
  string local_28;
  
  TVar2 = AnalyserEquationAst::type
                    ((ast->
                     super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
  if (TVar2 == CN) {
    AnalyserEquationAst::value_abi_cxx11_
              (&local_28,
               (ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr);
    convertToDouble(&local_28,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    bVar1 = local_30 < 0.0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Generator::GeneratorImpl::isNegativeNumber(const AnalyserEquationAstPtr &ast) const
{
    if (ast->type() == AnalyserEquationAst::Type::CN) {
        double doubleValue;

        convertToDouble(ast->value(), doubleValue);

        return doubleValue < 0.0;
    }

    return false;
}